

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  int iVar1;
  Expr *pA;
  Expr *pX;
  int iTab_local;
  Expr *pE2_local;
  Expr *pE1_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3ExprCompare(pParse,pE1,pE2,iTab);
  if (iVar1 == 0) {
    pParse_local._4_4_ = 1;
  }
  else if ((pE2->op == '+') &&
          ((iVar1 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab), iVar1 != 0 ||
           (iVar1 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab), iVar1 != 0)))) {
    pParse_local._4_4_ = 1;
  }
  else {
    if ((pE2->op == '3') && ((pE1->op != '2' && (pE1->op != '-')))) {
      pA = sqlite3ExprSkipCollate(pE1->pLeft);
      iVar1 = sqlite3ExprCompare(pParse,pA,pE2->pLeft,iTab);
      if (iVar1 == 0) {
        return 1;
      }
    }
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(Parse *pParse, Expr *pE1, Expr *pE2, int iTab){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL && pE1->op!=TK_ISNULL && pE1->op!=TK_IS ){
    Expr *pX = sqlite3ExprSkipCollate(pE1->pLeft);
    testcase( pX!=pE1->pLeft );
    if( sqlite3ExprCompare(pParse, pX, pE2->pLeft, iTab)==0 ) return 1;
  }
  return 0;
}